

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_fill.c
# Opt level: O3

MPP_RET fill_slice_syntax(H264_SLICE_t *currSlice,H264dDxvaCtx_t *dxva_ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  h264_pps_t *phVar3;
  h264_sps_t *phVar4;
  h264_refpic_info_t *phVar5;
  bool bVar6;
  _DXVA_Slice_H264_Long *p_Var7;
  uint uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0 *paVar12;
  
  uVar8 = dxva_ctx->slice_count;
  if (uVar8 < dxva_ctx->max_slice_size) {
    p_Var7 = dxva_ctx->slice_long;
  }
  else {
    uVar8 = dxva_ctx->max_slice_size + 5;
    dxva_ctx->max_slice_size = uVar8;
    p_Var7 = (_DXVA_Slice_H264_Long *)
             mpp_osal_realloc("realloc_slice_list",dxva_ctx->slice_long,(ulong)uVar8 * 0x98);
    dxva_ctx->slice_long = p_Var7;
    if (p_Var7 == (_DXVA_Slice_H264_Long *)0x0) {
      if ((h264d_debug & 1) != 0) {
        _mpp_log_l(4,"h264d_fill","malloc buffer error(%d).\n",(char *)0x0,0x24);
      }
      if ((h264d_debug & 4) == 0) {
        return MPP_ERR_MALLOC;
      }
      _mpp_log_l(4,"h264d_fill","Function error(%d).\n",(char *)0x0,0x31);
      if ((h264d_debug & 4) == 0) {
        return MPP_ERR_MALLOC;
      }
      _mpp_log_l(4,"h264d_fill","Function error(%d).\n",(char *)0x0,0x12d);
      return MPP_ERR_MALLOC;
    }
    uVar8 = dxva_ctx->slice_count;
  }
  memset(p_Var7 + uVar8,0,0x98);
  p_Var7[uVar8].BSNALunitDataLocation = dxva_ctx->strm_offset;
  p_Var7 = dxva_ctx->slice_long;
  uVar8 = dxva_ctx->slice_count;
  paVar12 = (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0 *)p_Var7[uVar8].RefPicList;
  p_Var7[uVar8].first_mb_in_slice = (RK_U16)currSlice->start_mb_nr;
  p_Var7[uVar8].NumMbsForSlice = 0;
  p_Var7[uVar8].slice_type = (RK_U8)currSlice->slice_type;
  phVar3 = currSlice->active_pps;
  p_Var7[uVar8].num_ref_idx_l0_active_minus1 = (RK_U8)phVar3->num_ref_idx_l0_default_active_minus1;
  p_Var7[uVar8].num_ref_idx_l1_active_minus1 = (RK_U8)phVar3->num_ref_idx_l1_default_active_minus1;
  p_Var7[uVar8].redundant_pic_cnt = (RK_U8)currSlice->redundant_pic_cnt;
  p_Var7[uVar8].direct_spatial_mv_pred_flag = (RK_U8)currSlice->direct_spatial_mv_pred_flag;
  p_Var7[uVar8].slice_id = (RK_U16)uVar8;
  phVar4 = currSlice->active_sps;
  p_Var7[uVar8].active_sps_id = phVar4->seq_parameter_set_id;
  p_Var7[uVar8].active_pps_id = phVar3->pic_parameter_set_id;
  uVar1 = currSlice->idr_flag;
  uVar2 = currSlice->idr_pic_id;
  p_Var7[uVar8].idr_pic_id = uVar2;
  p_Var7[uVar8].idr_flag = uVar1;
  p_Var7[uVar8].drpm_used_bitlen = currSlice->drpm_used_bitlen;
  p_Var7[uVar8].poc_used_bitlen = currSlice->poc_used_bitlen;
  p_Var7[uVar8].nal_ref_idc = currSlice->nal_reference_idc;
  p_Var7[uVar8].profileIdc = phVar4->profile_idc;
  lVar9 = 8;
  do {
    phVar5 = currSlice->p_Dec->refpic_info_p;
    if (*(int *)((long)phVar5 + lVar9 + -8) == 0) {
      *paVar12 = (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0)0xff;
    }
    else {
      fill_picture_entry((DXVA_PicEntry_H264 *)&paVar12->field_0,
                         *(RK_U32 *)((long)phVar5 + lVar9 + -4),
                         *(RK_U32 *)((long)&phVar5->valid + lVar9));
    }
    lVar9 = lVar9 + 0xc;
    paVar12 = paVar12 + 1;
  } while (lVar9 != 0x188);
  lVar9 = 0;
  bVar6 = true;
  do {
    bVar11 = bVar6;
    paVar12 = (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0 *)
              (p_Var7[uVar8].RefPicList + lVar9 + 1);
    lVar10 = 8;
    do {
      phVar5 = currSlice->p_Dec->refpic_info_b[lVar9];
      if (*(int *)((long)phVar5 + lVar10 + -8) == 0) {
        *paVar12 = (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0)0xff;
      }
      else {
        fill_picture_entry((DXVA_PicEntry_H264 *)&paVar12->field_0,
                           *(RK_U32 *)((long)phVar5 + lVar10 + -4),
                           *(RK_U32 *)((long)&phVar5->valid + lVar10));
      }
      paVar12 = paVar12 + 1;
      lVar10 = lVar10 + 0xc;
    } while (lVar10 != 0x188);
    lVar9 = 1;
    bVar6 = false;
  } while (bVar11);
  dxva_ctx->slice_count = dxva_ctx->slice_count + 1;
  return MPP_OK;
}

Assistant:

MPP_RET fill_slice_syntax(H264_SLICE_t *currSlice, H264dDxvaCtx_t *dxva_ctx)
{
    RK_U32 list = 0, i = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    DXVA_Slice_H264_Long *p_long  = NULL;
    RK_S32 dpb_idx = 0, dpb_valid = 0, bottom_flag = 0;

    FUN_CHECK(ret = fill_slice_stream(dxva_ctx, &currSlice->p_Cur->nalu));
    p_long  = &dxva_ctx->slice_long[dxva_ctx->slice_count];
    //!< fill slice long contents
    p_long->first_mb_in_slice = currSlice->start_mb_nr;
    p_long->NumMbsForSlice = 0;       //!< XXX it is set once we have all slices
    p_long->slice_type = currSlice->slice_type;
    p_long->num_ref_idx_l0_active_minus1 = currSlice->active_pps->num_ref_idx_l0_default_active_minus1;
    p_long->num_ref_idx_l1_active_minus1 = currSlice->active_pps->num_ref_idx_l1_default_active_minus1;
    p_long->redundant_pic_cnt = currSlice->redundant_pic_cnt;
    p_long->direct_spatial_mv_pred_flag = currSlice->direct_spatial_mv_pred_flag;
    p_long->slice_id = dxva_ctx->slice_count;
    //!< add parameters
    p_long->active_sps_id = currSlice->active_sps->seq_parameter_set_id;
    p_long->active_pps_id = currSlice->active_pps->pic_parameter_set_id;
    p_long->idr_pic_id = currSlice->idr_pic_id;
    p_long->idr_flag = currSlice->idr_flag;
    p_long->drpm_used_bitlen = currSlice->drpm_used_bitlen;
    p_long->poc_used_bitlen = currSlice->poc_used_bitlen;
    p_long->nal_ref_idc = currSlice->nal_reference_idc;
    p_long->profileIdc = currSlice->active_sps->profile_idc;

    for (i = 0; i < MPP_ARRAY_ELEMS(p_long->RefPicList[0]); i++) {
        dpb_idx = currSlice->p_Dec->refpic_info_p[i].dpb_idx;
        dpb_valid = currSlice->p_Dec->refpic_info_p[i].valid;
        //dpb_valid = (currSlice->p_Dec->dpb_info[dpb_idx].refpic ? 1 : 0);
        if (dpb_valid) {
            bottom_flag = currSlice->p_Dec->refpic_info_p[i].bottom_flag;
            fill_picture_entry(&p_long->RefPicList[0][i], dpb_idx, bottom_flag);
        } else {
            p_long->RefPicList[0][i].bPicEntry = 0xff;
        }
    }

    for (list = 0; list < 2; list++) {
        for (i = 0; i < MPP_ARRAY_ELEMS(p_long->RefPicList[list + 1]); i++) {
            dpb_idx = currSlice->p_Dec->refpic_info_b[list][i].dpb_idx;
            dpb_valid = currSlice->p_Dec->refpic_info_b[list][i].valid;
            //dpb_valid = (currSlice->p_Dec->dpb_info[dpb_idx].refpic ? 1 : 0);
            if (dpb_valid) {
                bottom_flag = currSlice->p_Dec->refpic_info_b[list][i].bottom_flag;
                fill_picture_entry(&p_long->RefPicList[list + 1][i], dpb_idx, bottom_flag);
            } else {
                p_long->RefPicList[list + 1][i].bPicEntry = 0xff;
            }
        }
    }
    dxva_ctx->slice_count++;

    return ret = MPP_OK;
__FAILED:
    return ret;
}